

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall pbrt::IPCChannel::~IPCChannel(IPCChannel *this)

{
  bool bVar1;
  IPCChannel *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = Connected(in_RDI);
  if (bVar1) {
    Disconnect((IPCChannel *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  std::__atomic_base<int>::operator--((__atomic_base<int> *)&numActiveChannels);
  std::__cxx11::string::~string((string *)&in_RDI->port);
  std::__cxx11::string::~string((string *)&in_RDI->address);
  return;
}

Assistant:

IPCChannel::~IPCChannel() {
    if (Connected())
        Disconnect();

    if (--numActiveChannels == 0) {
#ifdef PBRT_IS_WINDOWS
        WSACleanup();
#endif
    }
}